

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

void duckdb::GetBitStringAggregate(LogicalType *type,AggregateFunctionSet *bitstring_agg)

{
  LogicalType LVar1;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *pvVar2;
  InternalException *this;
  LogicalType *return_type;
  LogicalType *return_type_00;
  uint *return_type_01;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  allocator_type local_431;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *local_430;
  LogicalType local_428 [24];
  undefined1 local_410 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3f8;
  undefined1 local_3d8 [80];
  pointer pLStack_388;
  pointer local_380;
  LogicalType aLStack_348 [32];
  undefined8 auStack_328 [8];
  code *local_2e8;
  aggregate_statistics_t local_2d8;
  code *local_2d0;
  code *local_2c8;
  AggregateOrderDependent local_2c0;
  AggregateDistinctDependent AStack_2bf;
  element_type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a8 [48];
  LogicalType local_278 [96];
  LogicalType local_218 [32];
  undefined8 local_1f8 [14];
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  undefined1 local_178 [176];
  undefined8 auStack_c8 [14];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  bVar6 = 0;
  LVar1 = *type;
  if ((byte)LVar1 < 0x1c) {
    return_type_01 = &switchD_00402621::switchdataD_00774274;
    switch(LVar1) {
    case (LogicalType)0xb:
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,TINYINT);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<signed_char>,signed_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                 (LogicalType *)return_type_01);
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,TINYINT);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),TINYINT);
      duckdb::LogicalType::LogicalType(local_278,TINYINT);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l_01,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
      break;
    case (LogicalType)0xc:
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,SMALLINT);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<short>,short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                 (LogicalType *)return_type_01);
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,SMALLINT);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),SMALLINT);
      duckdb::LogicalType::LogicalType(local_278,SMALLINT);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l_02,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
      break;
    case (LogicalType)0xd:
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,INTEGER);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<int>,int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                 (LogicalType *)return_type_01);
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,INTEGER);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),INTEGER);
      duckdb::LogicalType::LogicalType(local_278,INTEGER);
      __l._M_len = 3;
      __l._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
      break;
    case (LogicalType)0xe:
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,BIGINT);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<long>,long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                 (LogicalType *)return_type_01);
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,BIGINT);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),BIGINT);
      duckdb::LogicalType::LogicalType(local_278,BIGINT);
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l_00,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
      break;
    default:
switchD_00402621_default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_3d8._0_8_ = local_3d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Unimplemented bitstring aggregate","");
      duckdb::InternalException::InternalException(this,(string *)local_3d8);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    return_type = (LogicalType *)(ulong)((byte)LVar1 - 0x1c);
    if ((byte)LVar1 - 0x1c < 4) {
      return_type_00 =
           (LogicalType *)
           ((long)&switchD_004024bc::switchdataD_00774284 +
           (long)(int)(&switchD_004024bc::switchdataD_00774284)[(long)return_type]);
      switch(return_type) {
      case (LogicalType *)0x0:
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,UTINYINT);
        duckdb::LogicalType::LogicalType(local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_char>,unsigned_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                   return_type_00);
        duckdb::LogicalType::~LogicalType(local_428);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
        local_178._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
        local_178[0xa8] = aLStack_348[0x18];
        local_178[0xa9] = aLStack_348[0x19];
        local_178[0xaa] = aLStack_348[0x1a];
        local_178[0xab] = aLStack_348[0x1b];
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = auStack_c8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        auStack_c8[0xd]._0_1_ = local_2c0;
        auStack_c8[0xd]._1_1_ = AStack_2bf;
        local_58 = local_2b8;
        local_50._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   (bitstring_agg + 0x20),(AggregateFunction *)local_178);
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        }
        local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *
                    )(bitstring_agg + 0x20);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
        duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,UTINYINT);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),UTINYINT);
        duckdb::LogicalType::LogicalType(local_278,UTINYINT);
        __l_07._M_len = 3;
        __l_07._M_array = (iterator)local_2a8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_3f8,__l_07,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLStack_388;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
        local_380 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d8._72_8_ =
             local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pLStack_388 = local_3f8.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
        pvVar2 = local_430;
        lVar3 = 0x30;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
        local_2a8._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType(local_218,aLStack_348);
        local_218[0x18] = aLStack_348[0x18];
        local_218[0x19] = aLStack_348[0x19];
        local_218[0x1a] = aLStack_348[0x1a];
        local_218[0x1b] = aLStack_348[0x1b];
        local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = local_1f8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
        break;
      case (LogicalType *)0x1:
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,USMALLINT);
        duckdb::LogicalType::LogicalType(local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_short>,unsigned_short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                   return_type_00);
        duckdb::LogicalType::~LogicalType(local_428);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
        local_178._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
        local_178[0xa8] = aLStack_348[0x18];
        local_178[0xa9] = aLStack_348[0x19];
        local_178[0xaa] = aLStack_348[0x1a];
        local_178[0xab] = aLStack_348[0x1b];
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = auStack_c8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        auStack_c8[0xd]._0_1_ = local_2c0;
        auStack_c8[0xd]._1_1_ = AStack_2bf;
        local_58 = local_2b8;
        local_50._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   (bitstring_agg + 0x20),(AggregateFunction *)local_178);
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        }
        local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *
                    )(bitstring_agg + 0x20);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
        duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,USMALLINT);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),USMALLINT);
        duckdb::LogicalType::LogicalType(local_278,USMALLINT);
        __l_08._M_len = 3;
        __l_08._M_array = (iterator)local_2a8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_3f8,__l_08,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLStack_388;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
        local_380 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d8._72_8_ =
             local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pLStack_388 = local_3f8.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
        pvVar2 = local_430;
        lVar3 = 0x30;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
        local_2a8._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType(local_218,aLStack_348);
        local_218[0x18] = aLStack_348[0x18];
        local_218[0x19] = aLStack_348[0x19];
        local_218[0x1a] = aLStack_348[0x1a];
        local_218[0x1b] = aLStack_348[0x1b];
        local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = local_1f8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
        break;
      case (LogicalType *)0x2:
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,UINTEGER);
        duckdb::LogicalType::LogicalType(local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_int>,unsigned_int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                   return_type_00);
        duckdb::LogicalType::~LogicalType(local_428);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
        local_178._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
        local_178[0xa8] = aLStack_348[0x18];
        local_178[0xa9] = aLStack_348[0x19];
        local_178[0xaa] = aLStack_348[0x1a];
        local_178[0xab] = aLStack_348[0x1b];
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = auStack_c8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        auStack_c8[0xd]._0_1_ = local_2c0;
        auStack_c8[0xd]._1_1_ = AStack_2bf;
        local_58 = local_2b8;
        local_50._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   (bitstring_agg + 0x20),(AggregateFunction *)local_178);
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        }
        local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *
                    )(bitstring_agg + 0x20);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
        duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,UINTEGER);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),UINTEGER);
        duckdb::LogicalType::LogicalType(local_278,UINTEGER);
        __l_03._M_len = 3;
        __l_03._M_array = (iterator)local_2a8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_3f8,__l_03,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLStack_388;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
        local_380 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d8._72_8_ =
             local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pLStack_388 = local_3f8.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
        pvVar2 = local_430;
        lVar3 = 0x30;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
        local_2a8._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType(local_218,aLStack_348);
        local_218[0x18] = aLStack_348[0x18];
        local_218[0x19] = aLStack_348[0x19];
        local_218[0x1a] = aLStack_348[0x1a];
        local_218[0x1b] = aLStack_348[0x1b];
        local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = local_1f8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
        break;
      case (LogicalType *)0x3:
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,UBIGINT);
        duckdb::LogicalType::LogicalType(local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_long>,unsigned_long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,
                   return_type_00);
        duckdb::LogicalType::~LogicalType(local_428);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
        local_178._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
        local_178[0xa8] = aLStack_348[0x18];
        local_178[0xa9] = aLStack_348[0x19];
        local_178[0xaa] = aLStack_348[0x1a];
        local_178[0xab] = aLStack_348[0x1b];
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = auStack_c8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        auStack_c8[0xd]._0_1_ = local_2c0;
        auStack_c8[0xd]._1_1_ = AStack_2bf;
        local_58 = local_2b8;
        local_50._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   (bitstring_agg + 0x20),(AggregateFunction *)local_178);
        local_178._0_8_ = &PTR__AggregateFunction_00890e90;
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        }
        local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *
                    )(bitstring_agg + 0x20);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
        duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,UBIGINT);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),UBIGINT);
        duckdb::LogicalType::LogicalType(local_278,UBIGINT);
        __l_04._M_len = 3;
        __l_04._M_array = (iterator)local_2a8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_3f8,__l_04,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLStack_388;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
        local_380 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d8._72_8_ =
             local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pLStack_388 = local_3f8.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
        pvVar2 = local_430;
        lVar3 = 0x30;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
        local_2a8._0_8_ = duckdb::Value::DECIMAL;
        duckdb::LogicalType::LogicalType(local_218,aLStack_348);
        local_218[0x18] = aLStack_348[0x18];
        local_218[0x19] = aLStack_348[0x19];
        local_218[0x1a] = aLStack_348[0x1a];
        local_218[0x1b] = aLStack_348[0x1b];
        local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
        puVar4 = auStack_328;
        puVar5 = local_1f8;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
      }
    }
    else if (LVar1 == (LogicalType)0x31) {
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,UHUGEINT);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,return_type
                );
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,UHUGEINT);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),UHUGEINT);
      duckdb::LogicalType::LogicalType(local_278,UHUGEINT);
      __l_05._M_len = 3;
      __l_05._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l_05,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
    }
    else {
      if (LVar1 != (LogicalType)0x32) goto switchD_00402621_default;
      duckdb::LogicalType::LogicalType((LogicalType *)local_410,HUGEINT);
      duckdb::LogicalType::LogicalType(local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_3d8,(AggregateFunction *)local_410,local_428,return_type
                );
      duckdb::LogicalType::~LogicalType(local_428);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_178,(SimpleFunction *)local_3d8);
      local_178._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType((LogicalType *)(local_178 + 0x90),aLStack_348);
      local_178[0xa8] = aLStack_348[0x18];
      local_178[0xa9] = aLStack_348[0x19];
      local_178[0xaa] = aLStack_348[0x1a];
      local_178[0xab] = aLStack_348[0x1b];
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = auStack_c8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      auStack_c8[0xd]._0_1_ = local_2c0;
      auStack_c8[0xd]._1_1_ = AStack_2bf;
      local_58 = local_2b8;
      local_50._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (bitstring_agg + 0x20),(AggregateFunction *)local_178);
      local_178._0_8_ = &PTR__AggregateFunction_00890e90;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      local_430 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                  (bitstring_agg + 0x20);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_178);
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,HUGEINT);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),HUGEINT);
      duckdb::LogicalType::LogicalType(local_278,HUGEINT);
      __l_06._M_len = 3;
      __l_06._M_array = (iterator)local_2a8;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3f8,__l_06,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = pLStack_388;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_3d8._72_8_;
      local_380 = local_3f8.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8._72_8_ =
           local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pLStack_388 = local_3f8.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
      pvVar2 = local_430;
      lVar3 = 0x30;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)local_3d8);
      local_2a8._0_8_ = duckdb::Value::DECIMAL;
      duckdb::LogicalType::LogicalType(local_218,aLStack_348);
      local_218[0x18] = aLStack_348[0x18];
      local_218[0x19] = aLStack_348[0x19];
      local_218[0x1a] = aLStack_348[0x1a];
      local_218[0x1b] = aLStack_348[0x1b];
      local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
      puVar4 = auStack_328;
      puVar5 = local_1f8;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>(pvVar2,(AggregateFunction *)local_2a8);
    }
  }
  local_2a8._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2a8);
  local_3d8._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
  return;
}

Assistant:

void GetBitStringAggregate(const LogicalType &type, AggregateFunctionSet &bitstring_agg) {
	switch (type.id()) {
	case LogicalType::TINYINT: {
		return BindBitString<int8_t>(bitstring_agg, type.id());
	}
	case LogicalType::SMALLINT: {
		return BindBitString<int16_t>(bitstring_agg, type.id());
	}
	case LogicalType::INTEGER: {
		return BindBitString<int32_t>(bitstring_agg, type.id());
	}
	case LogicalType::BIGINT: {
		return BindBitString<int64_t>(bitstring_agg, type.id());
	}
	case LogicalType::HUGEINT: {
		return BindBitString<hugeint_t>(bitstring_agg, type.id());
	}
	case LogicalType::UTINYINT: {
		return BindBitString<uint8_t>(bitstring_agg, type.id());
	}
	case LogicalType::USMALLINT: {
		return BindBitString<uint16_t>(bitstring_agg, type.id());
	}
	case LogicalType::UINTEGER: {
		return BindBitString<uint32_t>(bitstring_agg, type.id());
	}
	case LogicalType::UBIGINT: {
		return BindBitString<uint64_t>(bitstring_agg, type.id());
	}
	case LogicalType::UHUGEINT: {
		return BindBitString<uhugeint_t>(bitstring_agg, type.id());
	}
	default:
		throw InternalException("Unimplemented bitstring aggregate");
	}
}